

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

void anon_unknown.dwarf_3da77::JSONParser::handle_u_code
               (unsigned_long codepoint,qpdf_offset_t offset,unsigned_long *high_surrogate,
               qpdf_offset_t *high_offset,string *result)

{
  runtime_error *prVar1;
  string local_198;
  string local_178;
  undefined1 local_151;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined1 local_e9;
  string local_e8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  qpdf_offset_t local_38;
  qpdf_offset_t new_high_offset;
  string *result_local;
  qpdf_offset_t *high_offset_local;
  unsigned_long *high_surrogate_local;
  qpdf_offset_t offset_local;
  unsigned_long codepoint_local;
  
  new_high_offset = (qpdf_offset_t)result;
  result_local = (string *)high_offset;
  high_offset_local = (qpdf_offset_t *)high_surrogate;
  high_surrogate_local = (unsigned_long *)offset;
  offset_local = codepoint;
  if ((codepoint & 0xfc00) == 0xd800) {
    if (*high_offset != 0) {
      local_38 = offset;
      QTC::TC("libtests","JSON 16 high high",0);
      local_e9 = 1;
      prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&local_b8,local_38);
      std::operator+(&local_98,"JSON: offset ",&local_b8);
      std::operator+(&local_78,&local_98,
                     ": UTF-16 high surrogate found after previous high surrogate at offset ");
      std::__cxx11::to_string(&local_e8,*(longlong *)result_local);
      std::operator+(&local_58,&local_78,&local_e8);
      std::runtime_error::runtime_error(prVar1,(string *)&local_58);
      local_e9 = 0;
      __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    *high_offset = offset;
    *high_surrogate = codepoint;
  }
  else if ((codepoint & 0xfc00) == 0xdc00) {
    if (offset != *high_offset + 6) {
      QTC::TC("libtests","JSON 16 low not after high",0);
      local_151 = 1;
      prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&local_150,(longlong)high_surrogate_local);
      std::operator+(&local_130,"JSON: offset ",&local_150);
      std::operator+(&local_110,&local_130,
                     ": UTF-16 low surrogate found not immediately after high surrogate");
      std::runtime_error::runtime_error(prVar1,(string *)&local_110);
      local_151 = 0;
      __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    *high_offset = 0;
    offset_local = (ulong)(((uint)*high_surrogate & 0x3ff) << 10) + 0x10000 +
                   (ulong)((uint)codepoint & 0x3ff);
    QUtil::toUTF8_abi_cxx11_(&local_178,(QUtil *)offset_local,(unsigned_long)high_surrogate);
    std::__cxx11::string::operator+=((string *)new_high_offset,(string *)&local_178);
    std::__cxx11::string::~string((string *)&local_178);
  }
  else {
    QUtil::toUTF8_abi_cxx11_(&local_198,(QUtil *)codepoint,(unsigned_long)high_surrogate);
    std::__cxx11::string::operator+=((string *)new_high_offset,(string *)&local_198);
    std::__cxx11::string::~string((string *)&local_198);
  }
  return;
}

Assistant:

void
JSONParser::handle_u_code(
    unsigned long codepoint,
    qpdf_offset_t offset,
    unsigned long& high_surrogate,
    qpdf_offset_t& high_offset,
    std::string& result)
{
    if ((codepoint & 0xFC00) == 0xD800) {
        // high surrogate
        qpdf_offset_t new_high_offset = offset;
        if (high_offset) {
            QTC::TC("libtests", "JSON 16 high high");
            throw std::runtime_error(
                "JSON: offset " + std::to_string(new_high_offset) +
                ": UTF-16 high surrogate found after previous high surrogate at offset " +
                std::to_string(high_offset));
        }
        high_offset = new_high_offset;
        high_surrogate = codepoint;
    } else if ((codepoint & 0xFC00) == 0xDC00) {
        // low surrogate
        if (offset != (high_offset + 6)) {
            QTC::TC("libtests", "JSON 16 low not after high");
            throw std::runtime_error(
                "JSON: offset " + std::to_string(offset) +
                ": UTF-16 low surrogate found not immediately after high surrogate");
        }
        high_offset = 0;
        codepoint = 0x10000U + ((high_surrogate & 0x3FFU) << 10U) + (codepoint & 0x3FF);
        result += QUtil::toUTF8(codepoint);
    } else {
        result += QUtil::toUTF8(codepoint);
    }
}